

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

int __thiscall
SID::clock_resample_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  short *psVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  uVar2 = this->sample_offset;
  iVar9 = 0;
  do {
    uVar10 = this->cycles_per_sample + uVar2;
    iVar7 = (int)uVar10 >> 0x10;
    iVar4 = *delta_t;
    if (iVar4 < iVar7) goto LAB_0013cecc;
    if (n <= iVar9) {
      return iVar9;
    }
    iVar11 = iVar7;
    if (iVar7 < 1) {
      psVar5 = this->sample;
      iVar11 = iVar4;
    }
    else {
      do {
        clock(this);
        iVar1 = (this->extfilt).Vo;
        lVar3 = (long)iVar1;
        sVar6 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar1 >> 0x1f);
        if (lVar3 < -0x5800a) {
          sVar6 = -0x8000;
        }
        if (0x57fff < lVar3) {
          sVar6 = 0x7fff;
        }
        psVar5 = this->sample;
        iVar1 = this->sample_index;
        psVar5[(long)iVar1 + 0x4000] = sVar6;
        psVar5[iVar1] = sVar6;
        this->sample_index = iVar1 + 1U & 0x3fff;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      iVar11 = *delta_t;
    }
    *delta_t = iVar11 - iVar7;
    uVar2 = uVar10 & 0xffff;
    this->sample_offset = uVar2;
    lVar3 = (long)this->fir_N;
    if (lVar3 < 1) {
      iVar11 = 0;
    }
    else {
      lVar8 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + (int)this->fir[this->fir_N * ((int)(this->fir_RES * uVar2) >> 0x10) +
                                         lVar8] *
                          (int)psVar5[(long)this->sample_index + ((lVar8 + 0x4000) - lVar3)];
        lVar8 = lVar8 + 1;
      } while (lVar3 != lVar8);
      iVar11 = iVar11 >> 0xf;
    }
    if (iVar11 < -0x7fff) {
      iVar11 = -0x8000;
    }
    sVar6 = (short)iVar11;
    if (0x7ffe < iVar11) {
      sVar6 = 0x7fff;
    }
    iVar11 = iVar9 + 1;
    buf[iVar9 * interleave] = sVar6;
    iVar9 = iVar11;
  } while (iVar7 <= iVar4);
  iVar4 = *delta_t;
LAB_0013cecc:
  if (0 < iVar4) {
    iVar7 = 0;
    do {
      clock(this);
      iVar4 = (this->extfilt).Vo;
      lVar3 = (long)iVar4;
      sVar6 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar4 >> 0x1f);
      if (lVar3 < -0x5800a) {
        sVar6 = -0x8000;
      }
      if (0x57fff < lVar3) {
        sVar6 = 0x7fff;
      }
      psVar5 = this->sample;
      iVar4 = this->sample_index;
      psVar5[(long)iVar4 + 0x4000] = sVar6;
      psVar5[iVar4] = sVar6;
      this->sample_index = iVar4 + 1U & 0x3fff;
      iVar7 = iVar7 + 1;
      iVar4 = *delta_t;
    } while (iVar7 < iVar4);
    uVar2 = this->sample_offset;
  }
  this->sample_offset = uVar2 + iVar4 * -0x10000;
  *delta_t = 0;
  return iVar9;
}

Assistant:

RESID_INLINE
int SID::clock_resample_fast(cycle_count& delta_t, short* buf, int n,
			     int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v = 0;
    for (int j = 0; j < fir_N; j++) {
      v += sample_start[j]*fir_start[j];
    }

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}